

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O3

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::set_type(MutObjective *this,Type type)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  iVar2 = (this->
          super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  iVar3 = iVar2 + 0x3f;
  if (-1 < (long)iVar2) {
    iVar3 = iVar2;
  }
  lVar4 = (long)(iVar3 >> 6) * 8 +
          *(long *)&(((this->
                      super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                     problem_)->is_obj_max_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start;
  uVar5 = 1L << ((byte)iVar2 & 0x3f);
  lVar1 = (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8 + -8;
  if (type == MAX) {
    uVar5 = uVar5 | *(ulong *)(lVar4 + lVar1);
  }
  else {
    uVar5 = ~uVar5 & *(ulong *)(lVar4 + lVar1);
  }
  *(ulong *)(lVar4 + lVar1) = uVar5;
  return;
}

Assistant:

void set_type(obj::Type type) const {
      this->problem_->is_obj_max_[this->index_] = (type == obj::MAX);
    }